

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtEqual(word *pIn1,word *pIn2,int nWords)

{
  word *pwVar1;
  word *pwVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar4 == uVar3) {
      return 1;
    }
    pwVar1 = pIn1 + uVar3;
    pwVar2 = pIn2 + uVar3;
    uVar3 = uVar3 + 1;
  } while (*pwVar1 == *pwVar2);
  return 0;
}

Assistant:

static inline int Abc_TtEqual( word * pIn1, word * pIn2, int nWords )
{
    int w;
    for ( w = 0; w < nWords; w++ )
        if ( pIn1[w] != pIn2[w] )
            return 0;
    return 1;
}